

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O1

optional<const_google::protobuf::Message_*> __thiscall
google::protobuf::anon_unknown_19::GeneratedMessageFactory::FindInTypeMap
          (GeneratedMessageFactory *this,Descriptor *type)

{
  ctrl_t *pcVar1;
  _Storage<const_google::protobuf::Message_*,_true> _Var2;
  reference ppVar3;
  undefined8 extraout_RDX;
  undefined8 uVar4;
  optional<const_google::protobuf::Message_*> oVar5;
  iterator it;
  iterator local_40;
  Descriptor *local_30;
  iterator local_28;
  undefined7 extraout_var;
  
  local_30 = type;
  local_40 = absl::lts_20250127::container_internal::
             raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>>>
             ::find<google::protobuf::Descriptor_const*>
                       ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>>>
                         *)&this->type_map_,&local_30);
  pcVar1 = local_40.ctrl_;
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>_>_>
  ::AssertNotDebugCapacity
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>_>_>
              *)&this->type_map_);
  local_28.ctrl_ = (ctrl_t *)0x0;
  _Var2._0_1_ = absl::lts_20250127::container_internal::operator==(&local_40,&local_28);
  _Var2._1_7_ = extraout_var;
  if (_Var2._0_1_) {
    uVar4 = 0;
LAB_0024a6d6:
    oVar5.super__Optional_base<const_google::protobuf::Message_*,_true,_true>._M_payload.
    super__Optional_payload_base<const_google::protobuf::Message_*>._8_8_ = uVar4;
    oVar5.super__Optional_base<const_google::protobuf::Message_*,_true,_true>._M_payload.
    super__Optional_payload_base<const_google::protobuf::Message_*>._M_payload =
         (_Storage<const_google::protobuf::Message_*,_true>)
         (_Storage<const_google::protobuf::Message_*,_true>)_Var2._M_value;
    return (optional<const_google::protobuf::Message_*>)
           oVar5.super__Optional_base<const_google::protobuf::Message_*,_true,_true>._M_payload.
           super__Optional_payload_base<const_google::protobuf::Message_*>;
  }
  if (pcVar1 == (ctrl_t *)0x0) {
    _GLOBAL__N_1::GeneratedMessageFactory::FindInTypeMap();
  }
  else if (pcVar1 != absl::lts_20250127::container_internal::kEmptyGroup + 0x10) {
    if (kSentinel < *pcVar1) {
      ppVar3 = absl::lts_20250127::container_internal::
               raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::MessagePtr>_>_>
               ::iterator::operator*(&local_40);
      _Var2 = (_Storage<const_google::protobuf::Message_*,_true>)(ppVar3->second).value_;
      uVar4 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
      goto LAB_0024a6d6;
    }
    goto LAB_0024a6ea;
  }
  _GLOBAL__N_1::GeneratedMessageFactory::FindInTypeMap();
LAB_0024a6ea:
  _GLOBAL__N_1::GeneratedMessageFactory::FindInTypeMap();
}

Assistant:

ABSL_SHARED_LOCKS_REQUIRED(mutex_)
  {
    auto it = type_map_.find(type);
    if (it == type_map_.end()) return absl::nullopt;
    return it->second.get();
  }